

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O0

void pce_incbat(int *ip)

{
  bool bVar1;
  int iVar2;
  uint temp;
  uint flag;
  uint index;
  uint base;
  int h;
  int w;
  int y;
  int x;
  int l;
  int k;
  int j;
  int i;
  uchar ref;
  uchar *ptr;
  int *ip_local;
  
  ptr = (uchar *)ip;
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar2 = pcx_get_args((int *)ptr);
  if ((iVar2 != 0) &&
     (iVar2 = pcx_parse_args(1,pcx_nb_args + -1,&w,&h,(int *)&base,(int *)&index,8), iVar2 != 0)) {
    if (pass == 1) {
      temp = 0;
      bVar1 = false;
      flag = pcx_arg[0] >> 4;
      for (k = 0; k < (int)index; k = k + 1) {
        for (l = 0; l < (int)base; l = l + 1) {
          _i = pcx_buf + (long)((h + k * 8) * pcx_w) + (long)(w + l * 8);
          j._3_1_ = *_i & 0xf0;
          for (x = 0; x < 8; x = x + 1) {
            for (y = 0; y < 8; y = y + 1) {
              if ((_i[y] & 0xf0) != j._3_1_) {
                bVar1 = true;
              }
            }
            _i = _i + pcx_w;
          }
          buffer[temp << 1] = (uchar)(flag & 0xfff);
          buffer[temp * 2 + 1] = (byte)((flag & 0xfff) >> 8) | j._3_1_;
          temp = temp + 1;
          flag = flag + 1;
        }
      }
      if (bVar1) {
        error("Invalid color index found!");
      }
    }
    putbuffer(buffer,base * 2 * index);
    if (pass == 1) {
      println();
    }
  }
  return;
}

Assistant:

void
pce_incbat(int *ip)
{
	unsigned char *ptr, ref;
	int i, j, k, l, x, y, w, h;
	unsigned int base, index, flag;
	unsigned int temp;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(1, pcx_nb_args - 1, &x, &y, &w, &h, 8))
		return;

	/* build the BAT */
	if (pass == LAST_PASS) {
		index = 0;
		flag  = 0;
		base  = (pcx_arg[0] >> 4);

		for (i = 0; i < h; i++) {
			for (j = 0; j < w; j++) {
				ptr = pcx_buf + (x + (j * 8)) + ((y + (i * 8)) * pcx_w);
				ref = ptr[0] & 0xF0;

				/* check colors */
				for (k = 0; k < 8; k++) {
					for (l = 0; l < 8; l++) {
						if ((ptr[l] & 0xF0) != ref)
							flag = 1;
					}				
					ptr += pcx_w;
				}
				temp = (base & 0xFFF) | ((ref & 0xF0) << 8);
				buffer[2*index]   = temp & 0xff;
				buffer[2*index+1] = temp >> 8;

				index++;
				base++;
			}
		}

		/* errors */
		if (flag)
			error("Invalid color index found!");
	}

	/* store data */
	putbuffer(buffer, 2 * w * h);

	/* output */
	if (pass == LAST_PASS)
		println();
}